

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ricecomp.c
# Opt level: O0

int fits_rdecomp(uchar *c,int clen,uint *array,int nx,int nblock)

{
  int iVar1;
  int iVar2;
  byte *pbVar3;
  byte bVar4;
  int in_ECX;
  long in_RDX;
  int in_ESI;
  byte *in_RDI;
  int in_R8D;
  int bbits;
  int fsbits;
  int fsmax;
  uint lastpix;
  uint diff;
  uint b;
  uchar bytevalue;
  uchar *cend;
  int fs;
  int nzero;
  int nbits;
  int imax;
  int k;
  int i;
  uint local_58;
  uint local_54;
  uint local_50;
  int local_38;
  int local_34;
  int local_30;
  int local_2c;
  byte *local_10;
  
  if (in_ESI < 4) {
    ffpmsg((char *)0x25a6ed);
  }
  else {
    local_58 = (uint)*in_RDI << 0x18 | (uint)in_RDI[1] << 0x10 | (uint)in_RDI[2] << 8 |
               (uint)in_RDI[3];
    pbVar3 = in_RDI + 4;
    local_10 = in_RDI + 5;
    local_50 = (uint)*pbVar3;
    local_38 = 8;
    local_2c = 0;
    do {
      if (in_ECX <= local_2c) {
        if (local_10 < pbVar3 + (long)in_ESI + -4) {
          ffpmsg((char *)0x25ab4f);
        }
        return 0;
      }
      for (local_38 = local_38 + -5; local_38 < 0; local_38 = local_38 + 8) {
        local_50 = local_50 << 8 | (uint)*local_10;
        local_10 = local_10 + 1;
      }
      bVar4 = (byte)local_38;
      iVar1 = (local_50 >> (bVar4 & 0x1f)) - 1;
      local_50 = (1 << (bVar4 & 0x1f)) - 1U & local_50;
      local_34 = local_2c + in_R8D;
      if (in_ECX < local_34) {
        local_34 = in_ECX;
      }
      if (iVar1 < 0) {
        for (; local_2c < local_34; local_2c = local_2c + 1) {
          *(uint *)(in_RDX + (long)local_2c * 4) = local_58;
        }
      }
      else if (iVar1 == 0x19) {
        for (; local_2c < local_34; local_2c = local_2c + 1) {
          local_30 = 0x20 - local_38;
          local_54 = local_50 << ((byte)local_30 & 0x1f);
          while( true ) {
            local_30 = local_30 + -8;
            if (local_30 < 0) break;
            local_54 = (uint)*local_10 << ((byte)local_30 & 0x1f) | local_54;
            local_10 = local_10 + 1;
          }
          if (local_38 < 1) {
            local_50 = 0;
          }
          else {
            local_54 = *local_10 >> (-(byte)local_30 & 0x1f) | local_54;
            local_50 = (1 << (bVar4 & 0x1f)) - 1U & (uint)*local_10;
            local_10 = local_10 + 1;
          }
          if ((local_54 & 1) == 0) {
            local_54 = local_54 >> 1;
          }
          else {
            local_54 = local_54 >> 1 ^ 0xffffffff;
          }
          *(uint *)(in_RDX + (long)local_2c * 4) = local_54 + local_58;
          local_58 = *(uint *)(in_RDX + (long)local_2c * 4);
        }
      }
      else {
        for (; local_2c < local_34; local_2c = local_2c + 1) {
          while (local_50 == 0) {
            local_38 = local_38 + 8;
            local_50 = (uint)*local_10;
            local_10 = local_10 + 1;
          }
          iVar2 = local_38 - nonzero_count[local_50];
          local_38 = local_38 - (iVar2 + 1);
          local_50 = 1 << ((byte)local_38 & 0x1f) ^ local_50;
          for (local_38 = local_38 - iVar1; local_38 < 0; local_38 = local_38 + 8) {
            local_50 = local_50 << 8 | (uint)*local_10;
            local_10 = local_10 + 1;
          }
          local_54 = iVar2 << ((byte)iVar1 & 0x1f) | local_50 >> ((byte)local_38 & 0x1f);
          local_50 = (1 << ((byte)local_38 & 0x1f)) - 1U & local_50;
          if ((local_54 & 1) == 0) {
            local_54 = local_54 >> 1;
          }
          else {
            local_54 = local_54 >> 1 ^ 0xffffffff;
          }
          *(uint *)(in_RDX + (long)local_2c * 4) = local_54 + local_58;
          local_58 = *(uint *)(in_RDX + (long)local_2c * 4);
        }
      }
    } while (local_10 <= pbVar3 + (long)in_ESI + -4);
    ffpmsg((char *)0x25ab28);
  }
  return 1;
}

Assistant:

int fits_rdecomp (unsigned char *c,		/* input buffer			*/
	     int clen,			/* length of input		*/
	     unsigned int array[],	/* output array			*/
	     int nx,			/* number of output pixels	*/
	     int nblock)		/* coding block size		*/
{
/* int bsize;  */
int i, k, imax;
int nbits, nzero, fs;
unsigned char *cend, bytevalue;
unsigned int b, diff, lastpix;
int fsmax, fsbits, bbits;
extern const int nonzero_count[];

   /*
     * Original size of each pixel (bsize, bytes) and coding block
     * size (nblock, pixels)
     * Could make bsize a parameter to allow more efficient
     * compression of short & byte images.
     */
/*    bsize = 4; */

/*    nblock = 32; now an input parameter */
    /*
     * From bsize derive:
     * FSBITS = # bits required to store FS
     * FSMAX = maximum value for FS
     * BBITS = bits/pixel for direct coding
     */

/*
    switch (bsize) {
    case 1:
	fsbits = 3;
	fsmax = 6;
	break;
    case 2:
	fsbits = 4;
	fsmax = 14;
	break;
    case 4:
	fsbits = 5;
	fsmax = 25;
	break;
    default:
        ffpmsg("rdecomp: bsize must be 1, 2, or 4 bytes");
	return 1;
    }
*/

    /* move out of switch block, to tweak performance */
    fsbits = 5;
    fsmax = 25;

    bbits = 1<<fsbits;

    /*
     * Decode in blocks of nblock pixels
     */

    /* first 4 bytes of input buffer contain the value of the first */
    /* 4 byte integer value, without any encoding */
    
    if (clen < 4)
    {
       ffpmsg("decompression error: input buffer not properly allocated");
       return 1;
    }
    lastpix = 0;
    bytevalue = c[0];
    lastpix = lastpix | (bytevalue<<24);
    bytevalue = c[1];
    lastpix = lastpix | (bytevalue<<16);
    bytevalue = c[2];
    lastpix = lastpix | (bytevalue<<8);
    bytevalue = c[3];
    lastpix = lastpix | bytevalue;

    c += 4;  
    cend = c + clen - 4;

    b = *c++;		    /* bit buffer			*/
    nbits = 8;		    /* number of bits remaining in b	*/
    for (i = 0; i<nx; ) {
	/* get the FS value from first fsbits */
	nbits -= fsbits;
	while (nbits < 0) {
	    b = (b<<8) | (*c++);
	    nbits += 8;
	}
	fs = (b >> nbits) - 1;

	b &= (1<<nbits)-1;
	/* loop over the next block */
	imax = i + nblock;
	if (imax > nx) imax = nx;
	if (fs<0) {
	    /* low-entropy case, all zero differences */
	    for ( ; i<imax; i++) array[i] = lastpix;
	} else if (fs==fsmax) {
	    /* high-entropy case, directly coded pixel values */
	    for ( ; i<imax; i++) {
		k = bbits - nbits;
		diff = b<<k;
		for (k -= 8; k >= 0; k -= 8) {
		    b = *c++;
		    diff |= b<<k;
		}
		if (nbits>0) {
		    b = *c++;
		    diff |= b>>(-k);
		    b &= (1<<nbits)-1;
		} else {
		    b = 0;
		}
		/*
		 * undo mapping and differencing
		 * Note that some of these operations will overflow the
		 * unsigned int arithmetic -- that's OK, it all works
		 * out to give the right answers in the output file.
		 */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	} else {
	    /* normal case, Rice coding */
	    for ( ; i<imax; i++) {
		/* count number of leading zeros */
		while (b == 0) {
		    nbits += 8;
		    b = *c++;
		}
		nzero = nbits - nonzero_count[b];
		nbits -= nzero+1;
		/* flip the leading one-bit */
		b ^= 1<<nbits;
		/* get the FS trailing bits */
		nbits -= fs;
		while (nbits < 0) {
		    b = (b<<8) | (*c++);
		    nbits += 8;
		}
		diff = (nzero<<fs) | (b>>nbits);
		b &= (1<<nbits)-1;

		/* undo mapping and differencing */
		if ((diff & 1) == 0) {
		    diff = diff>>1;
		} else {
		    diff = ~(diff>>1);
		}
		array[i] = diff+lastpix;
		lastpix = array[i];
	    }
	}
	if (c > cend) {
            ffpmsg("decompression error: hit end of compressed byte stream");
	    return 1;
	}
    }
    if (c < cend) {
        ffpmsg("decompression warning: unused bytes at end of compressed buffer");
    }
    return 0;
}